

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotter.hpp
# Opt level: O0

char * nivalis::PointMarker::label_repr(int lab)

{
  int lab_local;
  char *local_8;
  
  switch(lab) {
  case 1:
    local_8 = "x-intercept\n";
    break;
  case 2:
    local_8 = "y-intercept\n";
    break;
  case 3:
    local_8 = "local minimum\n";
    break;
  case 4:
    local_8 = "local maximum\n";
    break;
  case 5:
    local_8 = "intersection\n";
    break;
  case 6:
    local_8 = "inflection point\n";
    break;
  default:
    local_8 = "";
  }
  return local_8;
}

Assistant:

static constexpr const char* label_repr(int lab) {
        switch(lab) {
            case LABEL_X_INT: return "x-intercept\n";
            case LABEL_Y_INT: return "y-intercept\n";
            case LABEL_LOCAL_MIN: return "local minimum\n";
            case LABEL_LOCAL_MAX: return "local maximum\n";
            case LABEL_INTERSECTION: return "intersection\n";
            case LABEL_INFLECTION_PT: return "inflection point\n";
            default: return "";
        }
    }